

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void SplitStringIntoKeyValuePairs
               (string *s,char *kv_split,char *pair_split,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *pairs)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  string key;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_a0 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)pairs;
  local_78 = pair_split;
  if (s->_M_string_length != 0) {
    uVar4 = 0;
    pbVar3 = &local_c0;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar4];
      pbVar2 = &local_98;
      if (cVar1 != *kv_split) {
        if (cVar1 == *local_78) {
          if (local_c0._M_string_length != 0) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      (&local_70,&local_c0,&local_98);
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_a0,&local_70)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
              operator_delete(local_70.second._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
              operator_delete(local_70.first._M_dataplus._M_p);
            }
          }
          local_c0._M_string_length = 0;
          *local_c0._M_dataplus._M_p = '\0';
          local_98._M_string_length = 0;
          *local_98._M_dataplus._M_p = '\0';
          pbVar2 = &local_c0;
        }
        else {
          std::__cxx11::string::push_back((char)pbVar3);
          pbVar2 = pbVar3;
        }
      }
      uVar4 = uVar4 + 1;
      pbVar3 = pbVar2;
    } while (uVar4 < s->_M_string_length);
  }
  if (local_c0._M_string_length != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_70,&local_c0,&local_98);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_a0,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void SplitStringIntoKeyValuePairs(
    const std::string& s,
    const char* kv_split,    // For instance: "="
    const char* pair_split,  // For instance: ","
    std::vector< std::pair<std::string, std::string> > *pairs) {
  std::string key, value;
  std::string* add_to = &key;
  for (std::string::size_type i = 0; i < s.length(); ++i) {
    if (s[i] == kv_split[0]) {
      add_to = &value;
    } else if (s[i] == pair_split[0]) {
      if (!key.empty())
        pairs->push_back(std::pair<std::string, std::string>(key, value));
      key.clear();
      value.clear();
      add_to = &key;
    } else {
      *add_to += s[i];
    }
  }
  if (!key.empty())
    pairs->push_back(std::pair<std::string, std::string>(key, value));
}